

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int exprRefToSrcList(Walker *pWalker,Expr *pExpr)

{
  RefSrcList *pRVar1;
  SrcList *pSVar2;
  ushort uVar3;
  long lVar4;
  
  if ((pExpr->op == 0xa9) || (pExpr->op == 0xa7)) {
    pRVar1 = (pWalker->u).pRefSrcList;
    pSVar2 = pRVar1->pRef;
    if ((pSVar2 != (SrcList *)0x0) && (0 < (long)pSVar2->nSrc)) {
      lVar4 = 0;
      do {
        if (pExpr->iTable == *(int *)((long)&pSVar2->a[0].iCursor + lVar4)) {
          uVar3 = 1;
          goto LAB_00190210;
        }
        lVar4 = lVar4 + 0x68;
      } while ((long)pSVar2->nSrc * 0x68 - lVar4 != 0);
    }
    uVar3 = 2;
    if (0 < pRVar1->nExclude) {
      lVar4 = 0;
      do {
        if (pRVar1->aiExclude[lVar4] == pExpr->iTable) {
          return 0;
        }
        lVar4 = lVar4 + 1;
      } while (pRVar1->nExclude != lVar4);
    }
LAB_00190210:
    pWalker->eCode = pWalker->eCode | uVar3;
  }
  return 0;
}

Assistant:

static int exprRefToSrcList(Walker *pWalker, Expr *pExpr){
  if( pExpr->op==TK_COLUMN
   || pExpr->op==TK_AGG_COLUMN
  ){
    int i;
    struct RefSrcList *p = pWalker->u.pRefSrcList;
    SrcList *pSrc = p->pRef;
    int nSrc = pSrc ? pSrc->nSrc : 0;
    for(i=0; i<nSrc; i++){
      if( pExpr->iTable==pSrc->a[i].iCursor ){
        pWalker->eCode |= 1;
        return WRC_Continue;
      }
    }
    for(i=0; i<p->nExclude && p->aiExclude[i]!=pExpr->iTable; i++){}
    if( i>=p->nExclude ){
      pWalker->eCode |= 2;
    }
  }
  return WRC_Continue;
}